

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O1

void GetOperand(char *oper,OpConfig *op,int pcconv)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  byte bVar10;
  undefined4 *puVar11;
  long lVar12;
  byte *pbVar13;
  int iVar14;
  undefined1 *puVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  char tempop [128];
  char UCoper [128];
  undefined8 uStack_140;
  byte local_138;
  byte local_137;
  char local_136;
  undefined1 local_b8 [2];
  char cStack_b6;
  
  pbVar13 = &local_138;
  op->Defn = 0;
  op->Mode = 0;
  op->Value = 0;
  op->X = 0;
  op->Single = 0;
  op->Hunk = 0x7fff;
  cVar1 = *oper;
  if (cVar1 == '\0') {
    return;
  }
  bVar10 = *oper;
  if (bVar10 == 0) {
    puVar11 = (undefined4 *)local_b8;
    lVar17 = 0;
  }
  else {
    lVar17 = 0;
    do {
      lVar16 = lVar17;
      *(byte *)((long)local_b8 + lVar16) = bVar10 & 0xdf;
      bVar10 = oper[lVar16 + 1];
      lVar17 = lVar16 + 1;
    } while (bVar10 != 0);
    puVar11 = (undefined4 *)((long)local_b8 + lVar16 + 1);
  }
  *(undefined1 *)puVar11 = 0;
  if (cVar1 == '#') {
    pcVar9 = oper + 1;
    if (oper[1] == '~') {
      pcVar9 = oper + 2;
    }
    uStack_140 = 0x1095b2;
    lVar17 = GetValue(pcVar9,op->Loc + 1);
    op->Value = lVar17;
    op->Mode = 0xc;
    lVar17 = Hunk2;
    op->Hunk = Hunk2;
    op->Defn = DefLine2;
    op->Single = SingleFlag;
    if (oper[1] != '~') {
      return;
    }
    if (lVar17 != 0x7fff) {
      uStack_140 = 0x109605;
      Error(op->Loc + 2,0xc);
      op->Hunk = 0x7fff;
    }
    uVar5 = ~op->Value;
    op->Value = uVar5;
    if (Size == 2) {
      uVar5 = uVar5 & 0xffff;
    }
    else {
      if (Size != 1) {
        return;
      }
      uVar5 = uVar5 & 0xff;
    }
LAB_001096b9:
    op->Value = uVar5;
    return;
  }
  lVar16 = lVar17 + -1;
  iVar4 = (int)lVar16;
  iVar14 = iVar4 + 1;
  uStack_140 = 0x109649;
  uVar3 = IsRegister(oper,iVar14);
  if (-1 < (int)uVar3) {
    op->Mode = 2 - (uint)((uVar3 & 8) == 0);
    uVar3 = uVar3 & 7;
    goto LAB_00109663;
  }
  if (uVar3 == 0xfffffffe) {
    op->Mode = 0xd;
    uVar5 = Sym->Val;
    goto LAB_001096b9;
  }
  if (*oper == '(') {
    if (oper[lVar16] != ')') {
      if ((oper[lVar16] == '+') && (oper[lVar17 + -2] == ')')) {
        op->Mode = 4;
        uStack_140 = 0x1096fc;
        uVar3 = GetAReg(oper + 1,iVar4 + -2,op->Loc + 1);
        goto LAB_00109663;
      }
      goto LAB_00109701;
    }
    iVar14 = iVar4 + -1;
    uStack_140 = 0x10969f;
    uVar3 = IsRegister(oper + 1,iVar14);
    if ((uVar3 & 0xfffffff8) == 8) {
      op->Mode = 3;
LAB_00109735:
      uVar3 = uVar3 - 8;
LAB_00109663:
      op->Rn = uVar3;
      return;
    }
    if (uVar3 != 0xffffffff) {
LAB_00109794:
      iVar4 = op->Loc;
      iVar14 = 8;
      goto LAB_0010979c;
    }
  }
  else {
LAB_00109701:
    if (((*oper == '-') && (oper[lVar16] == ')')) && (oper[1] == '(')) {
      iVar14 = iVar4 + -2;
      uStack_140 = 0x109720;
      uVar3 = IsRegister(oper + 2,iVar14);
      if ((uVar3 & 0xfffffff8) == 8) {
        op->Mode = 5;
        goto LAB_00109735;
      }
      if (0 < (int)uVar3) goto LAB_00109794;
    }
    else {
      if (cStack_b6 == '\0' && (short)_local_b8 == 0x5253) {
        op->Mode = 0xe;
        return;
      }
      if (_local_b8 == 0x505355) {
        op->Mode = 0x10;
        return;
      }
      if (_local_b8 == 0x524343) {
        op->Mode = 0xf;
        return;
      }
    }
  }
  lVar6 = lVar16;
  lVar12 = lVar16;
  if (oper[lVar16] == ')') {
    do {
      lVar6 = lVar12 + -1;
      if (lVar12 < 2) break;
      lVar2 = lVar12 + -1;
      lVar12 = lVar6;
    } while (oper[lVar2] != '(');
  }
  if (0 < lVar6 && oper[lVar16] == ')') {
    pcVar9 = oper + lVar6;
    if (lVar6 == 1) {
      bVar18 = *oper == '-';
    }
    else {
      if (pcVar9[-1] == '*') {
        uStack_140 = 0x109810;
        iVar4 = IsOperator(pcVar9 + -2);
        if ((iVar4 != 0) && (pcVar9[-2] != ')')) goto LAB_00109985;
        goto LAB_00109844;
      }
      uStack_140 = 0x10982c;
      iVar4 = IsOperator(pcVar9 + -1);
      if (iVar4 == 0) goto LAB_00109985;
      bVar18 = pcVar9[-1] != ')';
    }
    if (!bVar18) {
LAB_00109985:
      *pcVar9 = '\0';
      uStack_140 = 0x109994;
      lVar17 = GetValue(oper,op->Loc);
      op->Value = lVar17;
      op->Hunk = Hunk2;
      op->Defn = DefLine2;
      *pcVar9 = '(';
      iVar4 = op->Loc;
      uStack_140 = 0x1099cd;
      pcVar7 = GetField(pcVar9 + 1,(char *)&local_138);
      if (*pcVar7 == '\0') {
        uStack_140 = 0x1099dd;
        sVar8 = strlen((char *)&local_138);
        *(undefined1 *)((long)&uStack_140 + sVar8 + 7) = 0;
      }
      uVar3 = (uint)oper;
      if (((local_136 == '\0') && ((local_138 & 0xdf) == 0x50)) && ((local_137 & 0xdf) == 0x43)) {
        op->Mode = 10;
        if (op->Hunk == CurrHunk) {
          op->Value = op->Value - (pcconv + AddrCnt);
          op->Hunk = 0x7fff;
        }
      }
      else {
        if ((((op->Value != 0) || (op->Hunk != 0x7fff)) || (LineCount <= op->Defn)) ||
           (iVar14 = 3, (AdrModeA & 0x4000U) != 0 || NoOpt != 0)) {
          iVar14 = 6;
        }
        op->Mode = iVar14;
        uStack_140 = 0x109a80;
        sVar8 = strlen((char *)&local_138);
        uStack_140 = 0x109a8d;
        iVar4 = GetAReg((char *)&local_138,(int)sVar8,(iVar4 + (int)(pcVar9 + 1)) - uVar3);
        op->Rn = iVar4;
      }
      if (*pcVar7 != '\0') {
        op->Mode = (uint)(op->Mode == 10) * 4 + 7;
        if (*pcVar7 != ',') {
          uStack_140 = 0x109ac0;
          Error(op->Loc,8);
        }
        iVar4 = (op->Loc + (int)(pcVar7 + 1)) - uVar3;
        uStack_140 = 0x109ada;
        pcVar9 = GetField(pcVar7 + 1,(char *)&local_138);
        uStack_140 = 0x109ae5;
        sVar8 = strlen((char *)&local_138);
        if (*pcVar9 == '\0') {
          *(undefined1 *)((long)&uStack_140 + sVar8 + 7) = 0;
          pbVar13 = (byte *)((long)&uStack_140 + 7);
        }
        else {
          uStack_140 = 0x109afb;
          Error(iVar4,8);
        }
        puVar15 = pbVar13 + sVar8;
        if ((puVar15 + -2 < &local_138) || (puVar15[-2] != '.')) {
          op->Xsize = 2;
          iVar14 = (int)puVar15 + 1;
        }
        else {
          iVar14 = (int)puVar15 + -1;
          puVar15[-2] = 0;
          if ((puVar15[-1] & 0xdf) == 0x4c) {
            op->Xsize = 4;
          }
          else {
            if ((puVar15[-1] & 0xdf) != 0x57) {
              uStack_140 = 0x109b49;
              Error(~uVar3 + (int)pcVar9 + op->Loc,9);
            }
            op->Xsize = 2;
          }
        }
        uStack_140 = 0x109b71;
        uVar3 = IsRegister((char *)&local_138,iVar14 + ~(uint)&local_138);
        op->Xn = uVar3 & 7;
        if (uVar3 < 8) {
          op->X = 1;
        }
        else if ((uVar3 & 0xfffffff8) == 8) {
          op->X = 2;
        }
        else {
          uStack_140 = 0x109c3a;
          Error(iVar4,8);
        }
      }
      if (op->Hunk == 0x7fff || op->Hunk < 0) {
        return;
      }
      uStack_140 = 0x109c62;
      Error(op->Loc,0xc);
      return;
    }
  }
LAB_00109844:
  uStack_140 = 0x10984c;
  iVar4 = GetMultReg(oper,iVar14);
  if (iVar4 != 0) {
    op->Value = (long)iVar4;
    op->Mode = 0xd;
    return;
  }
  if (((*oper == '(') && (oper[lVar17 + -3] == ')')) &&
     ((oper[lVar17 + -2] == '.' &&
      (((oper[lVar16] & 0xdfU) == 0x57 || ((oper[lVar16] & 0xdfU) == 0x4c)))))) {
    oper[lVar17 + -2] = '\0';
    uStack_140 = 0x10989a;
    lVar6 = GetValue(oper,op->Loc);
    op->Value = lVar6;
    op->Hunk = Hunk2;
    op->Defn = DefLine2;
    op->Single = SingleFlag;
    op->Mode = (oper[lVar16] & 0xdfU) == 0x57 ^ 9;
    oper[lVar17 + -2] = '.';
    return;
  }
  uStack_140 = 0x1098ec;
  uVar5 = GetValue(oper,op->Loc);
  op->Value = uVar5;
  lVar17 = Hunk2;
  op->Hunk = Hunk2;
  iVar14 = DefLine2;
  op->Defn = DefLine2;
  op->Single = SingleFlag;
  op->Mode = 9;
  iVar4 = SmallData;
  if (NoOpt != 0) {
    return;
  }
  if (iVar14 < LineCount) {
    if (lVar17 < 0) {
      return;
    }
    if (lVar17 == CurrHunk) {
      if (pcconv == 0) {
        return;
      }
      lVar17 = uVar5 - (pcconv + AddrCnt);
      if ((short)lVar17 != lVar17) {
        return;
      }
      op->Mode = 10;
    }
    else {
      if (lVar17 == 0x7fff) {
        if ((long)(short)uVar5 != uVar5) {
          return;
        }
        goto LAB_00109cf1;
      }
      if (0xffff < uVar5 || SmallData == -1) {
        return;
      }
      op->Mode = 6;
      op->Rn = iVar4;
      lVar17 = uVar5 - DataOffset;
    }
    op->Value = lVar17;
  }
  else {
    if (SmallData == -1) {
      return;
    }
    if ((AdrModeA & 0x20U) != 0) {
      return;
    }
    if (Pass2 != 0) {
      if (-1 < lVar17) {
        if (lVar17 == CurrHunk) {
          op->Mode = 10;
          lVar17 = uVar5 - (pcconv + AddrCnt);
          op->Value = lVar17;
          op->Hunk = 0x7fff;
          if ((pcconv != 0) && (0xfffffffffffeffff < lVar17 - 0x8000U)) {
            return;
          }
        }
        else {
          if (lVar17 == 0x7fff) {
            op->Mode = 8;
          }
          else {
            op->Mode = 6;
            op->Rn = iVar4;
            uVar5 = uVar5 - DataOffset;
            op->Value = uVar5;
          }
          if ((long)(short)uVar5 == uVar5) {
            return;
          }
        }
        iVar4 = op->Loc;
        iVar14 = 0xe;
LAB_0010979c:
        Error(iVar4,iVar14);
        return;
      }
      uStack_140 = 0x109cf1;
      Error(op->Loc,0xe);
LAB_00109cf1:
      op->Mode = 8;
      return;
    }
    op->Mode = 6;
    op->Rn = iVar4;
  }
  op->Hunk = 0x7fff;
  return;
}

Assistant:

void 
GetOperand (char *oper, register struct OpConfig *op, int pcconv)
/* Finds mode and value for source or destination operand.
 If PC-relative addressing is permitted, "pcconv" gives the
 offset to the displacement word; otherwise "pcconv" is zero. */
{
	register char *s, *t;
	register int i;
	char *opend;
	char UCoper[MAXLINE], tempop[MAXLINE];
	int rloc;
	long templong;

	op->Value = op->Defn = 0;
	op->Mode = Null;
	op->X = X0;
	op->Hunk = ABSHUNK;
	op->Single = FALSE;

	if (*oper == '\0')
		return; /* There is nothing to process. */

	s = oper;
	t = UCoper;
	while (*s) {
#ifdef FASTTOUPPER
		*t++ = *s & (~ (1<<5)); /* Upper-case version */
#else
		*t++ = toupper(*s); /* Upper-case version */
#endif
		s++;
	}
	*t = '\0';
	opend = s - 1; /* Last character of operand */

	if (*oper == '#') { /* Immediate */
		s = oper + 1; /* The value starts here. */
		if (*s == '~')
			s++; /* Skip over unary NOT. */
		op->Value = GetValue(s, (op->Loc) + 1);
		op->Mode = Imm;
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if (*(oper + 1) == '~') { /* Unary NOT of entire value */
			if (Hunk2 != ABSHUNK) {
				Error(op->Loc + 2, RelErr);
				op->Hunk = ABSHUNK; /* Must be absolute! */
			}
			op->Value = ~(op->Value); /* Flip all bits. */
			if (Size == Byte)
				op->Value &= 0xFFL; /* Trim to 8 bits. */
			else if (Size == Word)
				op->Value &= 0xFFFFL; /* Trim to 16 bits. */
		}
		return;
	}

	i = IsRegister(oper, opend - oper + 1);
	if (i >= 0) {
		op->Mode = (i & 8) ? ARDir : DReg; /* Register type */
		op->Rn = i & 7; /* Register number */
		return;
	} else if (i == -2) {
		op->Mode = MultiM; /* Equated register list */
		op->Value = Sym->Val;
		return;
	} else if ((*oper == '(') && (*opend == ')')) {
		i = IsRegister(oper + 1, opend - oper - 1);
		if (i >= 8 && i <= 15) {
			op->Mode = ARInd; /* Address Register indirect */
			op->Rn = i - 8;
			return;
		} else if (i != -1) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else may be parenthesized expression */
	} else if ((*oper == '(') /* Post-increment */
	&& (*opend == '+') && (*(opend - 1) == ')')) {
		op->Mode = ARPost;
		op->Rn = GetAReg(oper + 1, opend - oper - 2, op->Loc + 1);
		return;
	} else if ((*oper == '-') /* Pre-decrement */
	&& (*opend == ')') && (*(oper + 1) == '(')) {
		i = IsRegister(oper + 2, opend - oper - 2);
		if (i >= 8 && i <= 15) {
			op->Mode = ARPre;
			op->Rn = i - 8;
			return;
		} else if (i > 0) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else parenthesized expression with leading minus? */
	} else if (strcmp(UCoper, "SR") == 0) {
		op->Mode = SR; /* Status Register */
		return;
	} else if (strcmp(UCoper, "CCR") == 0) {
		op->Mode = CCR; /* Condition Code Register */
		return;
	} else if (strcmp(UCoper, "USP") == 0) {
		op->Mode = USP; /* User Stack Pointer */
		return;
	}

	/* Try to split off displacement (if present).
	 We'll assume we have a register expression if the operand
	 ends with a parenthesized expression not preceded by an
	 operator.  I know this code is a real kludge, but that's
	 the result of the bloody syntax.  Thanks, Motorola.	*/

	s = opend; /* Last character */
	if ((i = (*s == ')'))) /* Trailing parenthesis? */
		while (*(--s) != '(') /* Find left parenthesis. */
			if (s <= oper)
				break;
	if (s <= oper) /* Must not be at beginning. */
		i = FALSE;
	if (i) {
		if (s == (oper + 1)) {
			if (*oper == '-')
				i = FALSE; /* Leading minus sign */
		} else {
			t = s - 1;
			if (*t == '*') { /* Location counter? */
				t--;
				if (!IsOperator(t) || (*t == ')'))
					i = FALSE; /* No, it's multiplication. */
			} else if (IsOperator(t) && (*t != ')')) {
				i = FALSE; /* Preceded by an operator */
			}
		}
	}

	if (i) { /* Looks like a displacement mode */
		*s = '\0';
		op->Value = GetValue(oper, op->Loc); /* Displacement */
		op->Hunk = Hunk2; /* Hunk number */
		op->Defn = DefLine2; /* Line where defined */
		*s++ = '('; /* Restore parenthesis. */

		rloc = op->Loc + s - oper; /* The register starts here. */
		s = GetField(s, tempop); /* Get address register. */
		if (*s == '\0') /* If there's no index register, */
			tempop[strlen(tempop) - 1] = '\0'; /* chop off parenthesis. */

		if ((tempop[2] == '\0') && ((tempop[0] & (~ (1<<5))) == 'P')
				&& ((tempop[1] & (~ (1<<5))) == 'C')) {
			op->Mode = PCDisp; /* Program Counter */
			if (op->Hunk == CurrHunk) {
				op->Value -= (AddrCnt + pcconv); /* Adjust displacement. */
				op->Hunk = ABSHUNK;
			}
		} else {
			if ((op->Value == 0) /* If displacement is zero   */
			&& (op->Hunk == ABSHUNK) /*  and is absolute          */
			&& (op->Defn < LineCount) /*  and is already defined   */
			&& !(OpM68R IN AdrModeA) /*  and isn't for a MOVEP    */
			&& !NoOpt) /*  and we can optimize      */
				op->Mode = ARInd; /*  forget the displacement. */
			else
				op->Mode = ARDisp; /* Address reg. w/displacement */
			op->Rn = GetAReg(tempop, strlen(tempop), rloc);
		}
		if (*s != '\0') { /* Index register is present. */
			if (op->Mode == PCDisp)
				op->Mode = PCDisX; /* Program Counter indexed */
			else
				op->Mode = ARDisX; /* Address Register indexed */
			if (*s != ',')
				Error(op->Loc, AddrErr); /* Bad separator */
			s++; /* Skip separator. */
			rloc = op->Loc + s - oper; /* Start of index */
			s = GetField(s, tempop); /* Get index register. */
			t = tempop + strlen(tempop);
			if (*s == '\0')
				*(--t) = '\0'; /* Chop parenthesis. */
			else
				Error(rloc, AddrErr); /* It better be there. */

			t -= 2;
			if ((t < tempop) || (*t != '.')) {
				op->Xsize = Word; /* Size defaults to 16 bits. */
				t += 3;
			} else {
				*t++ = '\0'; /* Chop off size code. */
				//switch (toupper(*t)) {
				switch (*t & (~ (1<<5))) {
				case 'W': /* Word */
					op->Xsize = Word;
					break;
				case 'L': /* Long */
					op->Xsize = Long;
					break;
				default:
					Error(op->Loc + s - 1 - oper, SizeErr); /* Invalid size */
					op->Xsize = Word; /* Make it word for now. */
				}
			}
			i = IsRegister(tempop, t - tempop - 1); /* Get register. */
			op->Xn = i & 7; /* Index register number */
			if ((i >= 0) && (i <= 7))
				op->X = Dreg; /* Data Register */
			else if ((i >= 8) && (i <= 15))
				op->X = Areg; /* Address Register */
			else
				Error(rloc, AddrErr); /* Invalid register */
		}

		if ((op->Hunk >= 0) && (op->Hunk != ABSHUNK))
			Error(op->Loc, RelErr); /*  Relocatable displacement */
		return;
	}

	if ((i = GetMultReg(oper, op->Loc)) != 0) {
		op->Value = (long) i;
		op->Mode = MultiM; /* Register list for MOVEM */
		return;
	}

	if ((*oper == '(') /* Operands of the form (xxxx).W or (xxxx).L */
	&& (*(opend - 2) == ')') && (*(opend - 1) == '.')
			&& (((*opend & (~ (1<<5))) == 'W') || ((*opend & (~ (1<<5))) == 'L'))) {
		*(opend - 1) = '\0'; /* Temporarily cut off length specifier. */
		op->Value = GetValue(oper, op->Loc); /* Get operand value. */
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if ((*opend & (~ (1<<5))) == 'W')
			op->Mode = AbsW; /* Absolute word */
		else
			op->Mode = AbsL; /* Absolute long */
		*(opend - 1) = '.'; /* Restore original operand. */
		return;
	}

	op->Value = GetValue(oper, op->Loc); /* Plain old expression */
	op->Hunk = Hunk2;
	op->Defn = DefLine2;
	op->Single = SingleFlag;
	op->Mode = AbsL; /* Assume absolute long addressing. */

	if (NoOpt)
		return; /* Do no optimizing. */

	if (DefLine2 < LineCount) { /* Backward reference */

		if (Hunk2 < 0) {
			return; /* External - leave as absolute long. */

		} else if (Hunk2 == CurrHunk) { /* Reference to current hunk */
			if (pcconv) {
				templong = op->Value - (AddrCnt + pcconv); /* PC disp. */
				if ((templong >= -32768) && (templong <= 32767)) {
					op->Mode = PCDisp; /* Convert to PC relative mode. */
					op->Value = templong; /* Adjust displacement. */
					op->Hunk = ABSHUNK;
				}
			}

		} else if (Hunk2 == ABSHUNK) { /* Absolute value */
			if ((op->Value >= -32768) && (op->Value <= 32767))
				op->Mode = AbsW; /* Absolute word */

		} else if ((SmallData != -1) && (op->Value >= 0)
				&& (op->Value <= 65535L)) {
			op->Mode = ARDisp; /* Make it a data reference     */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
		}
		return; /* Could default to absolute long. */

	} else if (SmallData == -1) { /* Fwd. reference - if not small data, */
		return; /*  leave as absolute long addressing. */

	} else if (Brnch IN AdrModeA) {
		return; /* Branches are handled elsewhere. */

	} else if (!Pass2) { /* Forward reference, pass 1 */
		op->Mode = ARDisp; /* Assume displacement       */
		op->Rn = SmallData; /*  from specified register. */
		op->Hunk = ABSHUNK;
		return;

	} else { /* On pass 2 we know what it is. */

		if (Hunk2 < 0) {
			Error(op->Loc, FwdRef); /* External - must be 32 bits. */
			op->Mode = AbsW; /* Force absolute word anyway. */

		} else if (Hunk2 == CurrHunk) { /* It's in the current hunk. */
			op->Mode = PCDisp; /* Convert to PC relative mode. */
			op->Value -= AddrCnt + pcconv; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
			if (!pcconv || (op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else if (Hunk2 == ABSHUNK) { /* It's absolute. */
			op->Mode = AbsW; /* It has to fit in a word. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else {
			op->Mode = ARDisp; /* Assume data reference        */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */
		}
	}
}